

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

DatatypeValidator * __thiscall
xercesc_4_0::TraverseSchema::getAttrDatatypeValidatorNS
          (TraverseSchema *this,DOMElement *elem,XMLCh *localPart,XMLCh *typeURI)

{
  uint saveScope_00;
  SchemaInfo *toRestore;
  bool bVar1;
  uint namespaceURI;
  SchemaInfo *this_00;
  DOMElement *childElem;
  DOMElement *typeElem;
  SchemaInfo *impInfo;
  uint uriId;
  uint saveScope;
  SchemaInfo *saveInfo;
  DatatypeValidator *pDStack_38;
  ListType infoType;
  DatatypeValidator *dv;
  XMLCh *typeURI_local;
  XMLCh *localPart_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  pDStack_38 = getDatatypeValidator(this,typeURI,localPart);
  saveInfo._4_4_ = INCLUDE;
  toRestore = this->fSchemaInfo;
  saveScope_00 = this->fCurrentScope;
  bVar1 = XMLString::equals(typeURI,this->fTargetNSURIString);
  if (((!bVar1) && (typeURI != (XMLCh *)0x0)) && (*typeURI != L'\0')) {
    namespaceURI = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                             (this->fURIStringPool,typeURI);
    bVar1 = isImportingNS(this,namespaceURI);
    if (!bVar1) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x8e,typeURI,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
      return (DatatypeValidator *)0x0;
    }
    if (pDStack_38 == (DatatypeValidator *)0x0) {
      this_00 = SchemaInfo::getImportInfo(this->fSchemaInfo,namespaceURI);
      if ((this_00 == (SchemaInfo *)0x0) || (bVar1 = SchemaInfo::getProcessed(this_00), bVar1)) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x28,typeURI,localPart,
                          (XMLCh *)0x0,(XMLCh *)0x0);
        return (DatatypeValidator *)0x0;
      }
      saveInfo._4_4_ = IMPORT;
      restoreSchemaInfo(this,this_00,IMPORT,0xfffffffe);
    }
  }
  if (pDStack_38 == (DatatypeValidator *)0x0) {
    childElem = SchemaInfo::getTopLevelComponent
                          (this->fSchemaInfo,1,(XMLCh *)SchemaSymbols::fgELT_SIMPLETYPE,localPart,
                           &this->fSchemaInfo);
    if (childElem != (DOMElement *)0x0) {
      pDStack_38 = traverseSimpleTypeDecl(this,childElem,true,0);
    }
    if (toRestore != this->fSchemaInfo) {
      restoreSchemaInfo(this,toRestore,saveInfo._4_4_,saveScope_00);
    }
  }
  return pDStack_38;
}

Assistant:

DatatypeValidator*
TraverseSchema::getAttrDatatypeValidatorNS(const DOMElement* const elem,
                                           const XMLCh* localPart,
                                           const XMLCh* typeURI)
{
    DatatypeValidator*   dv = getDatatypeValidator(typeURI, localPart);
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    SchemaInfo*          saveInfo = fSchemaInfo;
    unsigned int         saveScope = fCurrentScope;

    if (!XMLString::equals(typeURI, fTargetNSURIString)
        && (typeURI && *typeURI)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(typeURI);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, typeURI);
            return 0;
        }

        if (!dv) {
            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

            if (!impInfo || impInfo->getProcessed())
            {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, typeURI, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }

    if (!dv) {

        DOMElement* typeElem = fSchemaInfo->getTopLevelComponent
        (
            SchemaInfo::C_SimpleType
            , SchemaSymbols::fgELT_SIMPLETYPE
            , localPart
            , &fSchemaInfo
        );

        if (typeElem)
            dv = traverseSimpleTypeDecl(typeElem);

        // restore schema information, if necessary
        if (saveInfo != fSchemaInfo) {
            restoreSchemaInfo(saveInfo, infoType, saveScope);
        }
    }

    return dv;
}